

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O2

void __thiscall Simulator::dumpHistory(Simulator *this)

{
  pointer pbVar1;
  uint uVar2;
  ulong uVar3;
  string local_240;
  ofstream ofile;
  
  std::ofstream::ofstream((ostream *)&ofile,"dump.txt",_S_out);
  std::operator<<((ostream *)&ofile,"---------Execution History--------\n");
  uVar2 = 0;
  while( true ) {
    pbVar1 = (this->history).inst_record.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)uVar2;
    if ((ulong)((long)(this->history).inst_record.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar3)
    break;
    std::operator<<((ostream *)&ofile,(string *)(pbVar1 + uVar3));
    std::operator<<((ostream *)&ofile,
                    (string *)
                    ((this->history).reg_record.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar3));
    uVar2 = uVar2 + 1;
  }
  std::operator<<((ostream *)&ofile,"\n---------Memory Dump---------------\n");
  MemoryManager::dumpMemory_abi_cxx11_(&local_240,this->memory);
  std::operator<<((ostream *)&ofile,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::endl<char,std::char_traits<char>>((ostream *)&ofile);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofile);
  return;
}

Assistant:

void Simulator::dumpHistory() {
    std::ofstream ofile("dump.txt");
    ofile << "---------Execution History--------\n";
    for (uint32_t i = 0; i < this->history.inst_record.size(); i++) {
        ofile << this->history.inst_record[i];
        ofile << this->history.reg_record[i];
    }
    ofile << "\n---------Memory Dump---------------\n";
    ofile << memory->dumpMemory();
    ofile << std::endl;

    ofile.close();
}